

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O1

gdImagePtr gdImageScaleNearestNeighbour(gdImagePtr im,uint width,uint height)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  gdImagePtr pgVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  int *piVar10;
  ulong uVar11;
  uint sx;
  uint sy;
  
  sx = width + (width == 0);
  sy = height + (height == 0);
  iVar2 = im->sx;
  iVar3 = im->sy;
  pgVar5 = gdImageCreateTrueColor(sx,sy);
  if (pgVar5 == (gdImagePtr)0x0) {
    pgVar5 = (gdImagePtr)0x0;
  }
  else {
    lVar6 = (long)(((float)iVar2 / (float)sx) * 256.0);
    uVar7 = 0;
    do {
      lVar8 = (long)((ulong)(uint)((int)uVar7 << 8) * (long)(((float)iVar3 / (float)sy) * 256.0)) >>
              0x10;
      if (im->trueColor == 0) {
        puVar4 = im->pixels[lVar8];
        piVar10 = pgVar5->tpixels[uVar7];
        uVar11 = 0;
        do {
          bVar1 = puVar4[(long)((uVar11 & 0xffffffff) * lVar6) >> 0x10];
          *piVar10 = im->green[bVar1] * 0x100 +
                     im->red[bVar1] * 0x10000 + im->alpha[bVar1] * 0x1000000 + im->blue[bVar1];
          uVar11 = uVar11 + 0x100;
          piVar10 = piVar10 + 1;
        } while ((ulong)sx << 8 != uVar11);
      }
      else {
        piVar10 = im->tpixels[lVar8];
        piVar9 = pgVar5->tpixels[uVar7];
        uVar11 = 0;
        do {
          *piVar9 = piVar10[(long)((uVar11 & 0xffffffff) * lVar6) >> 0x10];
          uVar11 = uVar11 + 0x100;
          piVar9 = piVar9 + 1;
        } while ((ulong)sx << 8 != uVar11);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != sy);
  }
  return pgVar5;
}

Assistant:

static gdImagePtr
gdImageScaleNearestNeighbour(gdImagePtr im, const unsigned int width, const unsigned int height)
{
	const unsigned long new_width = MAX(1, width);
	const unsigned long new_height = MAX(1, height);
	const float dx = (float)im->sx / (float)new_width;
	const float dy = (float)im->sy / (float)new_height;
	const gdFixed f_dx = gd_ftofx(dx);
	const gdFixed f_dy = gd_ftofx(dy);

	gdImagePtr dst_img;
	unsigned long  dst_offset_x;
	unsigned long  dst_offset_y = 0;
	unsigned int i;

	dst_img = gdImageCreateTrueColor(new_width, new_height);

	if (dst_img == NULL) {
		return NULL;
	}

	for (i=0; i<new_height; i++) {
		unsigned int j;
		dst_offset_x = 0;
		if (im->trueColor) {
			for (j=0; j<new_width; j++) {
				const gdFixed f_i = gd_itofx(i);
				const gdFixed f_j = gd_itofx(j);
				const gdFixed f_a = gd_mulfx(f_i, f_dy);
				const gdFixed f_b = gd_mulfx(f_j, f_dx);
				const long m = gd_fxtoi(f_a);
				const long n = gd_fxtoi(f_b);

				dst_img->tpixels[dst_offset_y][dst_offset_x++] = im->tpixels[m][n];
			}
		} else {
			for (j=0; j<new_width; j++) {
				const gdFixed f_i = gd_itofx(i);
				const gdFixed f_j = gd_itofx(j);
				const gdFixed f_a = gd_mulfx(f_i, f_dy);
				const gdFixed f_b = gd_mulfx(f_j, f_dx);
				const long m = gd_fxtoi(f_a);
				const long n = gd_fxtoi(f_b);

				dst_img->tpixels[dst_offset_y][dst_offset_x++] = colorIndex2RGBA(im->pixels[m][n]);
			}
		}
		dst_offset_y++;
	}
	return dst_img;
}